

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_write_resp_hds(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  size_t sVar1;
  char *buf_00;
  CURLcode local_34;
  CURLcode result;
  size_t *pconsumed_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  if ((*(uint *)&(data->req).field_0xd1 & 1) == 0) {
    *pconsumed = 0;
    data_local._4_4_ = CURLE_OK;
  }
  else {
    local_34 = http_parse_headers(data,buf,blen,pconsumed);
    if ((local_34 == CURLE_OK) && ((*(uint *)&(data->req).field_0xd1 & 1) == 0)) {
      if ((*(uint *)&(data->req).field_0xd1 >> 0x11 & 1) == 0) {
        sVar1 = Curl_dyn_len(&(data->state).headerb);
        if (sVar1 != 0) {
          buf_00 = Curl_dyn_ptr(&(data->state).headerb);
          sVar1 = Curl_dyn_len(&(data->state).headerb);
          local_34 = Curl_client_write(data,1,buf_00,sVar1);
        }
      }
      Curl_dyn_free(&(data->state).headerb);
    }
    data_local._4_4_ = local_34;
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_http_write_resp_hds(struct Curl_easy *data,
                                  const char *buf, size_t blen,
                                  size_t *pconsumed)
{
  if(!data->req.header) {
    *pconsumed = 0;
    return CURLE_OK;
  }
  else {
    CURLcode result;

    result = http_parse_headers(data, buf, blen, pconsumed);
    if(!result && !data->req.header) {
      if(!data->req.no_body && Curl_dyn_len(&data->state.headerb)) {
        /* leftover from parsing something that turned out not
         * to be a header, only happens if we allow for
         * HTTP/0.9 like responses */
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   Curl_dyn_ptr(&data->state.headerb),
                                   Curl_dyn_len(&data->state.headerb));
      }
      Curl_dyn_free(&data->state.headerb);
    }
    return result;
  }
}